

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSemaphore.cpp
# Opt level: O2

void __thiscall TPZSemaphore::Post(TPZSemaphore *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->fMutex);
  this->fCounter = this->fCounter + 1;
  std::unique_lock<std::mutex>::unlock(&local_20);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void TPZSemaphore::Post()
{
	std::unique_lock lck(fMutex);
        
	fCounter++;
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "THREAD IN SEMAPHORE POST: " << std::this_thread::get_id() << " " << __LINE__ << std::endl;
		sout << "FCOUNTER VALUE : " << fCounter << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
  lck.unlock();
  fCond.notify_one();
	return;
}